

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

void __thiscall MADPComponentDiscreteStates::SetUniformISD(MADPComponentDiscreteStates *this)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [16];
  
  if (this->_m_initialized != false) {
    pdVar2 = (this->_m_initialStateDistribution->super_SDV).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar3 = (this->_m_initialStateDistribution->super_SDV).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (pdVar2 != pdVar3) {
      auVar17 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,this->_m_nrStates);
      auVar17._0_8_ = 1.0 / auVar17._0_8_;
      auVar17._8_8_ = 0;
      auVar13 = vpbroadcastq_avx512f();
      auVar13 = vpsrlq_avx512f(auVar13,3);
      auVar14 = vbroadcastsd_avx512f(auVar17);
      uVar12 = 0;
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar16 = vpbroadcastq_avx512f();
        auVar16 = vporq_avx512f(auVar16,auVar15);
        uVar11 = vpcmpuq_avx512f(auVar16,auVar13,2);
        pdVar1 = pdVar2 + uVar12;
        bVar4 = (bool)((byte)uVar11 & 1);
        bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
        *pdVar1 = (double)((ulong)bVar4 * auVar14._0_8_ | (ulong)!bVar4 * (long)*pdVar1);
        pdVar1[1] = (double)((ulong)bVar5 * auVar14._8_8_ | (ulong)!bVar5 * (long)pdVar1[1]);
        pdVar1[2] = (double)((ulong)bVar6 * auVar14._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
        pdVar1[3] = (double)((ulong)bVar7 * auVar14._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
        pdVar1[4] = (double)((ulong)bVar8 * auVar14._32_8_ | (ulong)!bVar8 * (long)pdVar1[4]);
        pdVar1[5] = (double)((ulong)bVar9 * auVar14._40_8_ | (ulong)!bVar9 * (long)pdVar1[5]);
        pdVar1[6] = (double)((ulong)bVar10 * auVar14._48_8_ | (ulong)!bVar10 * (long)pdVar1[6]);
        pdVar1[7] = (double)((uVar11 >> 7) * auVar14._56_8_ |
                            (ulong)!SUB81(uVar11 >> 7,0) * (long)pdVar1[7]);
        uVar12 = uVar12 + 8;
      } while ((((ulong)((long)pdVar3 + (-8 - (long)pdVar2)) >> 3) + 8 & 0xfffffffffffffff8) !=
               uVar12);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," MADPComponentDiscreteStates::SetUniformISD - ERROR can\'t",0x39
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "set uniform init. state distr., when not initialized! (don\'t know how many state yet...)"
             ,0x58);
  return;
}

Assistant:

void MADPComponentDiscreteStates::SetUniformISD()
{
    //cout << " MADPComponentDiscreteStates::SetUniformISD called"<<endl;
    if(!_m_initialized)
    {
        cout << " MADPComponentDiscreteStates::SetUniformISD - ERROR can't"<<
            "set uniform init. state distr., when not initialized! (don't know how many state yet...)";
        return;
    }
    double uprob = 1.0 / GetNrStates();
    vector<double>::iterator it = _m_initialStateDistribution->begin();
    vector<double>::iterator last = _m_initialStateDistribution->end();
    while(it!=last)
    {
        *it = uprob;
        it++;
    }
}